

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

void Abc_FlowRetime_ConstrainConserv(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  void **__ptr;
  void *pArray;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  pManMR->nExactConstraints = 0;
  while (iVar2 = Vec_PtrSize(pManMR->vExactNodes), iVar2 != 0) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrPop(pManMR->vExactNodes);
    pVVar1 = pManMR->vTimeEdges;
    uVar3 = Abc_ObjId(pAVar4);
    iVar2 = Vec_PtrSize(pVVar1 + uVar3);
    if (iVar2 != 0) {
      pVVar1 = pManMR->vTimeEdges;
      uVar3 = Abc_ObjId(pAVar4);
      __ptr = Vec_PtrReleaseArray(pVVar1 + uVar3);
      if (__ptr != (void **)0x0) {
        free(__ptr);
      }
    }
  }
  if (pManMR->fIsForward == 0) {
    Abc_FlowRetime_ConstrainConserv_back(pNtk);
  }
  else {
    Abc_FlowRetime_ConstrainConserv_forw(pNtk);
  }
  pArray._4_4_ = 0;
  do {
    iVar2 = Vec_PtrSize(pNtk->vObjs);
    if (iVar2 <= pArray._4_4_) {
      return;
    }
    pAVar4 = Abc_NtkObj(pNtk,pArray._4_4_);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      pVVar1 = pManMR->vTimeEdges;
      uVar3 = Abc_ObjId(pAVar4);
      iVar2 = Vec_PtrSize(pVVar1 + uVar3);
      if (iVar2 != 0) {
        __assert_fail("!Vec_PtrSize(FTIMEEDGES(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                      ,0x73,"void Abc_FlowRetime_ConstrainConserv(Abc_Ntk_t *)");
      }
    }
    pArray._4_4_ = pArray._4_4_ + 1;
  } while( true );
}

Assistant:

void Abc_FlowRetime_ConstrainConserv( Abc_Ntk_t * pNtk ) {  
  Abc_Obj_t *pObj;
  int i;
  void *pArray;

  // clear all exact constraints
  pManMR->nExactConstraints = 0;
  while( Vec_PtrSize( pManMR->vExactNodes )) {
    pObj = (Abc_Obj_t*)Vec_PtrPop( pManMR->vExactNodes );
    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  }

#if !defined(IGNORE_TIMING)
  if (pManMR->fIsForward) {
    Abc_FlowRetime_ConstrainConserv_forw(pNtk);
  } else {
    Abc_FlowRetime_ConstrainConserv_back(pNtk);
  }
#endif

  Abc_NtkForEachObj( pNtk, pObj, i)
    assert( !Vec_PtrSize(FTIMEEDGES(pObj)) );
}